

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlFARecurseDeterminism(xmlRegParserCtxtPtr ctxt,xmlRegStatePtr state,int to,xmlRegAtomPtr atom)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int extraout_EDX;
  int iVar4;
  ulong uVar5;
  
  iVar4 = 1;
  if ((state != (xmlRegStatePtr)0x0) && (state->markd != XML_REGEXP_MARK_VISITED)) {
    uVar5 = 0;
    uVar2 = (ulong)(uint)state->nbTrans;
    if (state->nbTrans < 1) {
      uVar2 = uVar5;
    }
    iVar4 = 1;
    for (; uVar2 * 0x18 - uVar5 != 0; uVar5 = uVar5 + 0x18) {
      if ((*(long *)((long)&state->trans->atom + uVar5) == 0) &&
         (lVar3 = (long)*(int *)((long)&state->trans->to + uVar5), -1 < lVar3)) {
        state->markd = XML_REGEXP_MARK_VISITED;
        iVar1 = xmlFARecurseDeterminism
                          (ctxt,*(xmlRegStatePtr *)(&((xmlRegAtomPtr)ctxt->states)->no + lVar3 * 2),
                           to,(xmlRegAtomPtr)ctxt->states);
        to = extraout_EDX;
        if (iVar1 == 0) {
          iVar4 = 0;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int
xmlFARecurseDeterminism(xmlRegParserCtxtPtr ctxt, xmlRegStatePtr state,
	                 int to, xmlRegAtomPtr atom) {
    int ret = 1;
    int res;
    int transnr, nbTrans;
    xmlRegTransPtr t1;
    int deep = 1;

    if (state == NULL)
	return(ret);
    if (state->markd == XML_REGEXP_MARK_VISITED)
	return(ret);

    if (ctxt->flags & AM_AUTOMATA_RNG)
        deep = 0;

    /*
     * don't recurse on transitions potentially added in the course of
     * the elimination.
     */
    nbTrans = state->nbTrans;
    for (transnr = 0;transnr < nbTrans;transnr++) {
	t1 = &(state->trans[transnr]);
	/*
	 * check transitions conflicting with the one looked at
	 */
	if (t1->atom == NULL) {
	    if (t1->to < 0)
		continue;
	    state->markd = XML_REGEXP_MARK_VISITED;
	    res = xmlFARecurseDeterminism(ctxt, ctxt->states[t1->to],
		                           to, atom);
	    if (res == 0) {
	        ret = 0;
		/* t1->nd = 1; */
	    }
	    continue;
	}
	if (t1->to != to)
	    continue;
	if (xmlFACompareAtoms(t1->atom, atom, deep)) {
	    ret = 0;
	    /* mark the transition as non-deterministic */
	    t1->nd = 1;
	}
    }
    return(ret);
}